

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_iterative.c
# Opt level: O0

SUNErrCode SUNModifiedGS(N_Vector *v,sunrealtype **h,int k,int p,sunrealtype *new_vk_norm)

{
  long lVar1;
  sunrealtype sVar2;
  int iVar3;
  int iVar4;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  double *in_R8;
  sunrealtype temp;
  sunrealtype vk_norm;
  sunrealtype new_product;
  sunrealtype new_norm_2;
  int i0;
  int k_minus_1;
  int i;
  SUNContext sunctx_local_scope_;
  N_Vector in_stack_ffffffffffffff78;
  N_Vector in_stack_ffffffffffffff80;
  double dVar5;
  N_Vector in_stack_ffffffffffffff88;
  N_Vector x;
  undefined4 in_stack_ffffffffffffff90;
  int iVar6;
  double local_68;
  double local_48;
  int local_34;
  
  sVar2 = N_VDotProd(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  if (0.0 < sVar2) {
    local_68 = sqrt(sVar2);
  }
  else {
    local_68 = 0.0;
  }
  iVar3 = in_EDX + -1;
  if (in_EDX - in_ECX < 1) {
    iVar4 = 0;
    local_34 = iVar4;
    iVar6 = iVar4;
  }
  else {
    iVar4 = in_EDX - in_ECX;
    local_34 = iVar4;
    iVar6 = iVar4;
  }
  for (; local_34 < in_EDX; local_34 = local_34 + 1) {
    sVar2 = N_VDotProd(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    *(sunrealtype *)(*(long *)(in_RSI + (long)local_34 * 8) + (long)iVar3 * 8) = sVar2;
    N_VLinearSum((sunrealtype)CONCAT44(iVar4,in_stack_ffffffffffffff90),in_stack_ffffffffffffff88,
                 (sunrealtype)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,(N_Vector)0x10a274
                );
  }
  sVar2 = N_VDotProd(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  *in_R8 = sVar2;
  if (0.0 < *in_R8) {
    x = (N_Vector)sqrt(*in_R8);
  }
  else {
    x = (N_Vector)0x0;
  }
  *in_R8 = (double)x;
  local_68 = local_68 * 1000.0;
  if ((local_68 + *in_R8 == local_68) && (!NAN(local_68 + *in_R8) && !NAN(local_68))) {
    local_48 = 0.0;
    for (local_34 = iVar6; local_34 < in_EDX; local_34 = local_34 + 1) {
      sVar2 = N_VDotProd(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      dVar5 = *(double *)(*(long *)(in_RSI + (long)local_34 * 8) + (long)iVar3 * 8) * 1000.0;
      if ((dVar5 + sVar2 != dVar5) || (NAN(dVar5 + sVar2) || NAN(dVar5))) {
        lVar1 = *(long *)(in_RSI + (long)local_34 * 8);
        *(double *)(lVar1 + (long)iVar3 * 8) = sVar2 + *(double *)(lVar1 + (long)iVar3 * 8);
        N_VLinearSum((sunrealtype)CONCAT44(iVar4,in_stack_ffffffffffffff90),x,
                     (sunrealtype)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                     (N_Vector)0x10a427);
        local_48 = sVar2 * sVar2 + local_48;
      }
    }
    if ((local_48 != 0.0) || (NAN(local_48))) {
      dVar5 = *in_R8 * *in_R8 + -local_48;
      if (dVar5 <= 0.0) {
        dVar5 = 0.0;
      }
      else if (0.0 < dVar5) {
        dVar5 = sqrt(dVar5);
      }
      else {
        dVar5 = 0.0;
      }
      *in_R8 = dVar5;
    }
  }
  return 0;
}

Assistant:

SUNErrCode SUNModifiedGS(N_Vector* v, sunrealtype** h, int k, int p,
                         sunrealtype* new_vk_norm)
{
  SUNFunctionBegin(v[0]->sunctx);

  int i, k_minus_1, i0;
  sunrealtype new_norm_2, new_product, vk_norm, temp;

  vk_norm = N_VDotProd(v[k], v[k]);
  SUNCheckLastErr();
  vk_norm   = SUNRsqrt(vk_norm);
  k_minus_1 = k - 1;
  i0        = SUNMAX(k - p, 0);

  /* Perform modified Gram-Schmidt */

  for (i = i0; i < k; i++)
  {
    h[i][k_minus_1] = N_VDotProd(v[i], v[k]);
    SUNCheckLastErr();
    N_VLinearSum(ONE, v[k], -h[i][k_minus_1], v[i], v[k]);
    SUNCheckLastErr();
  }

  /* Compute the norm of the new vector at v[k] */

  *new_vk_norm = N_VDotProd(v[k], v[k]);
  SUNCheckLastErr();
  *new_vk_norm = SUNRsqrt(*new_vk_norm);

  /* If the norm of the new vector at v[k] is less than
     FACTOR (== 1000) times unit roundoff times the norm of the
     input vector v[k], then the vector will be reorthogonalized
     in order to ensure that nonorthogonality is not being masked
     by a very small vector length. */

  temp = FACTOR * vk_norm;
  if ((temp + (*new_vk_norm)) != temp) { return SUN_SUCCESS; }

  new_norm_2 = ZERO;

  for (i = i0; i < k; i++)
  {
    new_product = N_VDotProd(v[i], v[k]);
    SUNCheckLastErr();
    temp = FACTOR * h[i][k_minus_1];
    if ((temp + new_product) == temp) { continue; }
    h[i][k_minus_1] += new_product;
    N_VLinearSum(ONE, v[k], -new_product, v[i], v[k]);
    SUNCheckLastErr();
    new_norm_2 += SUNSQR(new_product);
  }

  if (new_norm_2 != ZERO)
  {
    new_product  = SUNSQR(*new_vk_norm) - new_norm_2;
    *new_vk_norm = (new_product > ZERO) ? SUNRsqrt(new_product) : ZERO;
  }

  return SUN_SUCCESS;
}